

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int setn(lua_State *L)

{
  luaL_checktype(L,1,5);
  luaL_error(L,"\'setn\' is obsolete");
  lua_pushvalue(L,1);
  return 1;
}

Assistant:

static int setn (lua_State *L) {
  luaL_checktype(L, 1, LUA_TTABLE);
#ifndef luaL_setn
  luaL_setn(L, 1, luaL_checkint(L, 2));
#else
  luaL_error(L, LUA_QL("setn") " is obsolete");
#endif
  lua_pushvalue(L, 1);
  return 1;
}